

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::Detail::convertIntoString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,StringRef string,bool escapeInvisibles)

{
  char cVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cVar1 = (char)__return_storage_ptr__;
  if ((char)string.m_size == '\0') {
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)this);
  }
  else {
    std::__cxx11::string::push_back(cVar1);
    if (string.m_start != (char *)0x0) {
      pcVar2 = (char *)0x0;
      do {
        if (((byte)((char)this[(long)pcVar2] - 9U) < 5) &&
           ((0x1bU >> ((byte)((char)this[(long)pcVar2] - 9U) & 0x1f) & 1) != 0)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::push_back(cVar1);
        }
        pcVar2 = pcVar2 + 1;
      } while (string.m_start != pcVar2);
    }
  }
  std::__cxx11::string::push_back(cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string convertIntoString(StringRef string, bool escapeInvisibles) {
        std::string ret;
        // This is enough for the "don't escape invisibles" case, and a good
        // lower bound on the "escape invisibles" case.
        ret.reserve(string.size() + 2);

        if (!escapeInvisibles) {
            ret += '"';
            ret += string;
            ret += '"';
            return ret;
        }

        ret += '"';
        for (char c : string) {
            switch (c) {
            case '\r':
                ret.append("\\r");
                break;
            case '\n':
                ret.append("\\n");
                break;
            case '\t':
                ret.append("\\t");
                break;
            case '\f':
                ret.append("\\f");
                break;
            default:
                ret.push_back(c);
                break;
            }
        }
        ret += '"';

        return ret;
    }